

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_1,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::TriangleMIntersectorKMoeller<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  ushort uVar24;
  uint uVar25;
  long lVar26;
  undefined1 (*pauVar27) [64];
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  ulong *puVar31;
  NodeRef root;
  long lVar32;
  long lVar33;
  undefined4 uVar34;
  ulong uVar35;
  int iVar36;
  undefined1 auVar37 [16];
  int iVar59;
  int iVar60;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  int iVar61;
  int iVar73;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar74 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM20 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  vfloat<16> t;
  vfloat<16> v;
  vfloat<16> u;
  TravRayK<16,_false> tray;
  Vec3vf<16> Ng;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a95c;
  Precalculations local_a941;
  size_t local_a940;
  RayQueryContext *local_a938;
  uint local_a930;
  uint local_a92c;
  RayK<16> *local_a928;
  Geometry *local_a920;
  BVH *local_a918;
  Intersectors *local_a910;
  ulong local_a908;
  long local_a900;
  long local_a8f8;
  RTCFilterFunctionNArguments local_a8f0;
  undefined1 local_a8c0 [16];
  _Head_base<1UL,_embree::vfloat_impl<16>_&,_false> _Stack_a8b0;
  _Head_base<0UL,_embree::vfloat_impl<16>_&,_false> _Stack_a8a8;
  undefined1 auStack_a8a0 [32];
  undefined1 local_a880 [64];
  undefined1 local_a840 [64];
  undefined1 local_a800 [64];
  undefined1 local_a7c0 [64];
  undefined1 local_a780 [64];
  undefined1 local_a740 [64];
  undefined1 local_a700 [64];
  undefined1 local_a6c0 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a680;
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [64];
  undefined1 local_a440 [64];
  undefined1 local_a400 [64];
  undefined1 local_a3c0 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a380;
  undefined1 local_a2c0 [64];
  undefined1 local_a280 [64];
  undefined1 local_a240 [64];
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  undefined1 local_a0c0 [64];
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  uint local_9fc0;
  uint uStack_9fbc;
  uint uStack_9fb8;
  uint uStack_9fb4;
  uint uStack_9fb0;
  uint uStack_9fac;
  uint uStack_9fa8;
  uint uStack_9fa4;
  uint uStack_9fa0;
  uint uStack_9f9c;
  uint uStack_9f98;
  uint uStack_9f94;
  uint uStack_9f90;
  uint uStack_9f8c;
  uint uStack_9f88;
  uint uStack_9f84;
  uint local_9f80;
  uint uStack_9f7c;
  uint uStack_9f78;
  uint uStack_9f74;
  uint uStack_9f70;
  uint uStack_9f6c;
  uint uStack_9f68;
  uint uStack_9f64;
  uint uStack_9f60;
  uint uStack_9f5c;
  uint uStack_9f58;
  uint uStack_9f54;
  uint uStack_9f50;
  uint uStack_9f4c;
  uint uStack_9f48;
  uint uStack_9f44;
  undefined8 local_9f40;
  undefined8 uStack_9f38;
  undefined8 uStack_9f30;
  undefined8 uStack_9f28;
  undefined8 uStack_9f20;
  undefined8 uStack_9f18;
  undefined8 uStack_9f10;
  undefined8 uStack_9f08;
  undefined8 local_9f00;
  undefined8 uStack_9ef8;
  undefined8 uStack_9ef0;
  undefined8 uStack_9ee8;
  undefined8 uStack_9ee0;
  undefined8 uStack_9ed8;
  undefined8 uStack_9ed0;
  undefined8 uStack_9ec8;
  undefined8 local_9ec0;
  undefined8 uStack_9eb8;
  undefined8 uStack_9eb0;
  undefined8 uStack_9ea8;
  undefined8 uStack_9ea0;
  undefined8 uStack_9e98;
  undefined8 uStack_9e90;
  undefined8 uStack_9e88;
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_a918 = (BVH *)This->ptr;
  local_9e48 = (local_a918->root).ptr;
  if (local_9e48 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar38 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
      auVar74 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar35 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar74,5);
      uVar30 = vpcmpeqd_avx512f(auVar38,(undefined1  [64])valid_i->field_0);
      uVar35 = uVar35 & uVar30;
      if ((ushort)uVar35 != 0) {
        local_a380.field_0.x.field_0 = (vfloat_impl<16>)*(undefined1 (*) [64])ray;
        local_a380.field_0.y.field_0 = (vfloat_impl<16>)*(undefined1 (*) [64])(ray + 0x40);
        local_a380.field_0.z.field_0 = (vfloat_impl<16>)*(undefined1 (*) [64])(ray + 0x80);
        local_a2c0 = *(undefined1 (*) [64])(ray + 0x100);
        local_a280 = *(undefined1 (*) [64])(ray + 0x140);
        local_a240 = *(undefined1 (*) [64])(ray + 0x180);
        auVar38 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
        auVar39 = vandps_avx512dq(local_a2c0,auVar38);
        auVar40 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
        uVar30 = vcmpps_avx512f(auVar39,auVar40,1);
        bVar23 = (bool)((byte)uVar30 & 1);
        iVar36 = auVar40._0_4_;
        auVar39._0_4_ = (uint)bVar23 * iVar36 | (uint)!bVar23 * local_a2c0._0_4_;
        bVar23 = (bool)((byte)(uVar30 >> 1) & 1);
        iVar59 = auVar40._4_4_;
        auVar39._4_4_ = (uint)bVar23 * iVar59 | (uint)!bVar23 * local_a2c0._4_4_;
        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
        iVar60 = auVar40._8_4_;
        auVar39._8_4_ = (uint)bVar23 * iVar60 | (uint)!bVar23 * local_a2c0._8_4_;
        bVar23 = (bool)((byte)(uVar30 >> 3) & 1);
        iVar61 = auVar40._12_4_;
        auVar39._12_4_ = (uint)bVar23 * iVar61 | (uint)!bVar23 * local_a2c0._12_4_;
        bVar23 = (bool)((byte)(uVar30 >> 4) & 1);
        iVar62 = auVar40._16_4_;
        auVar39._16_4_ = (uint)bVar23 * iVar62 | (uint)!bVar23 * local_a2c0._16_4_;
        bVar23 = (bool)((byte)(uVar30 >> 5) & 1);
        iVar63 = auVar40._20_4_;
        auVar39._20_4_ = (uint)bVar23 * iVar63 | (uint)!bVar23 * local_a2c0._20_4_;
        bVar23 = (bool)((byte)(uVar30 >> 6) & 1);
        iVar64 = auVar40._24_4_;
        auVar39._24_4_ = (uint)bVar23 * iVar64 | (uint)!bVar23 * local_a2c0._24_4_;
        bVar23 = (bool)((byte)(uVar30 >> 7) & 1);
        iVar65 = auVar40._28_4_;
        auVar39._28_4_ = (uint)bVar23 * iVar65 | (uint)!bVar23 * local_a2c0._28_4_;
        bVar23 = (bool)((byte)(uVar30 >> 8) & 1);
        iVar66 = auVar40._32_4_;
        auVar39._32_4_ = (uint)bVar23 * iVar66 | (uint)!bVar23 * local_a2c0._32_4_;
        bVar23 = (bool)((byte)(uVar30 >> 9) & 1);
        iVar67 = auVar40._36_4_;
        auVar39._36_4_ = (uint)bVar23 * iVar67 | (uint)!bVar23 * local_a2c0._36_4_;
        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
        iVar68 = auVar40._40_4_;
        auVar39._40_4_ = (uint)bVar23 * iVar68 | (uint)!bVar23 * local_a2c0._40_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xb) & 1);
        iVar69 = auVar40._44_4_;
        auVar39._44_4_ = (uint)bVar23 * iVar69 | (uint)!bVar23 * local_a2c0._44_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xc) & 1);
        iVar70 = auVar40._48_4_;
        auVar39._48_4_ = (uint)bVar23 * iVar70 | (uint)!bVar23 * local_a2c0._48_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xd) & 1);
        iVar71 = auVar40._52_4_;
        auVar39._52_4_ = (uint)bVar23 * iVar71 | (uint)!bVar23 * local_a2c0._52_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xe) & 1);
        iVar72 = auVar40._56_4_;
        iVar73 = auVar40._60_4_;
        auVar39._56_4_ = (uint)bVar23 * iVar72 | (uint)!bVar23 * local_a2c0._56_4_;
        bVar23 = SUB81(uVar30 >> 0xf,0);
        auVar39._60_4_ = (uint)bVar23 * iVar73 | (uint)!bVar23 * local_a2c0._60_4_;
        auVar41 = vandps_avx512dq(local_a280,auVar38);
        uVar30 = vcmpps_avx512f(auVar41,auVar40,1);
        bVar23 = (bool)((byte)uVar30 & 1);
        auVar41._0_4_ = (uint)bVar23 * iVar36 | (uint)!bVar23 * local_a280._0_4_;
        bVar23 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar23 * iVar59 | (uint)!bVar23 * local_a280._4_4_;
        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar23 * iVar60 | (uint)!bVar23 * local_a280._8_4_;
        bVar23 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar23 * iVar61 | (uint)!bVar23 * local_a280._12_4_;
        bVar23 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar23 * iVar62 | (uint)!bVar23 * local_a280._16_4_;
        bVar23 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar23 * iVar63 | (uint)!bVar23 * local_a280._20_4_;
        bVar23 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar23 * iVar64 | (uint)!bVar23 * local_a280._24_4_;
        bVar23 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar23 * iVar65 | (uint)!bVar23 * local_a280._28_4_;
        bVar23 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar41._32_4_ = (uint)bVar23 * iVar66 | (uint)!bVar23 * local_a280._32_4_;
        bVar23 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar41._36_4_ = (uint)bVar23 * iVar67 | (uint)!bVar23 * local_a280._36_4_;
        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar41._40_4_ = (uint)bVar23 * iVar68 | (uint)!bVar23 * local_a280._40_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar41._44_4_ = (uint)bVar23 * iVar69 | (uint)!bVar23 * local_a280._44_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar41._48_4_ = (uint)bVar23 * iVar70 | (uint)!bVar23 * local_a280._48_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar41._52_4_ = (uint)bVar23 * iVar71 | (uint)!bVar23 * local_a280._52_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar41._56_4_ = (uint)bVar23 * iVar72 | (uint)!bVar23 * local_a280._56_4_;
        bVar23 = SUB81(uVar30 >> 0xf,0);
        auVar41._60_4_ = (uint)bVar23 * iVar73 | (uint)!bVar23 * local_a280._60_4_;
        auVar38 = vandps_avx512dq(local_a240,auVar38);
        uVar30 = vcmpps_avx512f(auVar38,auVar40,1);
        auVar38 = vrcp14ps_avx512f(auVar39);
        bVar23 = (bool)((byte)uVar30 & 1);
        auVar40._0_4_ = (uint)bVar23 * iVar36 | (uint)!bVar23 * local_a240._0_4_;
        bVar23 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar23 * iVar59 | (uint)!bVar23 * local_a240._4_4_;
        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar23 * iVar60 | (uint)!bVar23 * local_a240._8_4_;
        bVar23 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar23 * iVar61 | (uint)!bVar23 * local_a240._12_4_;
        bVar23 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar23 * iVar62 | (uint)!bVar23 * local_a240._16_4_;
        bVar23 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar23 * iVar63 | (uint)!bVar23 * local_a240._20_4_;
        bVar23 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar23 * iVar64 | (uint)!bVar23 * local_a240._24_4_;
        bVar23 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar40._28_4_ = (uint)bVar23 * iVar65 | (uint)!bVar23 * local_a240._28_4_;
        bVar23 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar40._32_4_ = (uint)bVar23 * iVar66 | (uint)!bVar23 * local_a240._32_4_;
        bVar23 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar40._36_4_ = (uint)bVar23 * iVar67 | (uint)!bVar23 * local_a240._36_4_;
        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar40._40_4_ = (uint)bVar23 * iVar68 | (uint)!bVar23 * local_a240._40_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar40._44_4_ = (uint)bVar23 * iVar69 | (uint)!bVar23 * local_a240._44_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar40._48_4_ = (uint)bVar23 * iVar70 | (uint)!bVar23 * local_a240._48_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar40._52_4_ = (uint)bVar23 * iVar71 | (uint)!bVar23 * local_a240._52_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar40._56_4_ = (uint)bVar23 * iVar72 | (uint)!bVar23 * local_a240._56_4_;
        bVar23 = SUB81(uVar30 >> 0xf,0);
        auVar40._60_4_ = (uint)bVar23 * iVar73 | (uint)!bVar23 * local_a240._60_4_;
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar43 = vrcp14ps_avx512f(auVar41);
        auVar39 = vfnmadd213ps_avx512f(auVar39,auVar38,auVar42);
        local_a200 = vfmadd132ps_avx512f(auVar39,auVar38,auVar38);
        auVar38 = vfnmadd213ps_avx512f(auVar41,auVar43,auVar42);
        auVar39 = vrcp14ps_avx512f(auVar40);
        local_a1c0 = vfmadd132ps_avx512f(auVar38,auVar43,auVar43);
        auVar38 = vfnmadd213ps_avx512f(auVar40,auVar39,auVar42);
        local_a180 = vfmadd132ps_avx512f(auVar38,auVar39,auVar39);
        local_a140 = vmulps_avx512f((undefined1  [64])local_a380.field_0.x.field_0,local_a200);
        local_a100 = vmulps_avx512f((undefined1  [64])local_a380.field_0.y.field_0,local_a1c0);
        local_a0c0 = vmulps_avx512f((undefined1  [64])local_a380.field_0.z.field_0,local_a180);
        uVar30 = vcmpps_avx512f(local_a200,auVar74,1);
        auVar38 = vpbroadcastd_avx512f(ZEXT416(0x20));
        auVar42._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar38._4_4_;
        auVar42._0_4_ = (uint)((byte)uVar30 & 1) * auVar38._0_4_;
        auVar42._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar38._8_4_;
        auVar42._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar38._12_4_;
        auVar42._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar38._16_4_;
        auVar42._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar38._20_4_;
        auVar42._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar38._24_4_;
        auVar42._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar38._28_4_;
        auVar42._32_4_ = (uint)((byte)(uVar30 >> 8) & 1) * auVar38._32_4_;
        auVar42._36_4_ = (uint)((byte)(uVar30 >> 9) & 1) * auVar38._36_4_;
        auVar42._40_4_ = (uint)((byte)(uVar30 >> 10) & 1) * auVar38._40_4_;
        auVar42._44_4_ = (uint)((byte)(uVar30 >> 0xb) & 1) * auVar38._44_4_;
        auVar42._48_4_ = (uint)((byte)(uVar30 >> 0xc) & 1) * auVar38._48_4_;
        auVar42._52_4_ = (uint)((byte)(uVar30 >> 0xd) & 1) * auVar38._52_4_;
        auVar42._56_4_ = (uint)((byte)(uVar30 >> 0xe) & 1) * auVar38._56_4_;
        auVar42._60_4_ = (uint)(byte)(uVar30 >> 0xf) * auVar38._60_4_;
        local_a080 = vmovdqa64_avx512f(auVar42);
        uVar30 = vcmpps_avx512f(local_a1c0,auVar74,5);
        auVar38 = vpbroadcastd_avx512f(ZEXT416(0x60));
        auVar39 = vpbroadcastd_avx512f(ZEXT416(0x40));
        bVar23 = (bool)((byte)uVar30 & 1);
        auVar43._0_4_ = (uint)bVar23 * auVar39._0_4_ | (uint)!bVar23 * auVar38._0_4_;
        bVar23 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar23 * auVar39._4_4_ | (uint)!bVar23 * auVar38._4_4_;
        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar23 * auVar39._8_4_ | (uint)!bVar23 * auVar38._8_4_;
        bVar23 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar23 * auVar39._12_4_ | (uint)!bVar23 * auVar38._12_4_;
        bVar23 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar43._16_4_ = (uint)bVar23 * auVar39._16_4_ | (uint)!bVar23 * auVar38._16_4_;
        bVar23 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar43._20_4_ = (uint)bVar23 * auVar39._20_4_ | (uint)!bVar23 * auVar38._20_4_;
        bVar23 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar43._24_4_ = (uint)bVar23 * auVar39._24_4_ | (uint)!bVar23 * auVar38._24_4_;
        bVar23 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar43._28_4_ = (uint)bVar23 * auVar39._28_4_ | (uint)!bVar23 * auVar38._28_4_;
        bVar23 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar43._32_4_ = (uint)bVar23 * auVar39._32_4_ | (uint)!bVar23 * auVar38._32_4_;
        bVar23 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar43._36_4_ = (uint)bVar23 * auVar39._36_4_ | (uint)!bVar23 * auVar38._36_4_;
        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar43._40_4_ = (uint)bVar23 * auVar39._40_4_ | (uint)!bVar23 * auVar38._40_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar43._44_4_ = (uint)bVar23 * auVar39._44_4_ | (uint)!bVar23 * auVar38._44_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar43._48_4_ = (uint)bVar23 * auVar39._48_4_ | (uint)!bVar23 * auVar38._48_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar43._52_4_ = (uint)bVar23 * auVar39._52_4_ | (uint)!bVar23 * auVar38._52_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar43._56_4_ = (uint)bVar23 * auVar39._56_4_ | (uint)!bVar23 * auVar38._56_4_;
        bVar23 = SUB81(uVar30 >> 0xf,0);
        auVar43._60_4_ = (uint)bVar23 * auVar39._60_4_ | (uint)!bVar23 * auVar38._60_4_;
        local_a040 = vmovdqa64_avx512f(auVar43);
        uVar30 = vcmpps_avx512f(local_a180,auVar74,5);
        auVar38 = vpbroadcastd_avx512f(ZEXT416(0xa0));
        auVar39 = vpbroadcastd_avx512f(ZEXT416(0x80));
        bVar23 = (bool)((byte)uVar30 & 1);
        auVar44._0_4_ = (uint)bVar23 * auVar39._0_4_ | (uint)!bVar23 * auVar38._0_4_;
        bVar23 = (bool)((byte)(uVar30 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar23 * auVar39._4_4_ | (uint)!bVar23 * auVar38._4_4_;
        bVar23 = (bool)((byte)(uVar30 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar23 * auVar39._8_4_ | (uint)!bVar23 * auVar38._8_4_;
        bVar23 = (bool)((byte)(uVar30 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar23 * auVar39._12_4_ | (uint)!bVar23 * auVar38._12_4_;
        bVar23 = (bool)((byte)(uVar30 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar23 * auVar39._16_4_ | (uint)!bVar23 * auVar38._16_4_;
        bVar23 = (bool)((byte)(uVar30 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar23 * auVar39._20_4_ | (uint)!bVar23 * auVar38._20_4_;
        bVar23 = (bool)((byte)(uVar30 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar23 * auVar39._24_4_ | (uint)!bVar23 * auVar38._24_4_;
        bVar23 = (bool)((byte)(uVar30 >> 7) & 1);
        auVar44._28_4_ = (uint)bVar23 * auVar39._28_4_ | (uint)!bVar23 * auVar38._28_4_;
        bVar23 = (bool)((byte)(uVar30 >> 8) & 1);
        auVar44._32_4_ = (uint)bVar23 * auVar39._32_4_ | (uint)!bVar23 * auVar38._32_4_;
        bVar23 = (bool)((byte)(uVar30 >> 9) & 1);
        auVar44._36_4_ = (uint)bVar23 * auVar39._36_4_ | (uint)!bVar23 * auVar38._36_4_;
        bVar23 = (bool)((byte)(uVar30 >> 10) & 1);
        auVar44._40_4_ = (uint)bVar23 * auVar39._40_4_ | (uint)!bVar23 * auVar38._40_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xb) & 1);
        auVar44._44_4_ = (uint)bVar23 * auVar39._44_4_ | (uint)!bVar23 * auVar38._44_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xc) & 1);
        auVar44._48_4_ = (uint)bVar23 * auVar39._48_4_ | (uint)!bVar23 * auVar38._48_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xd) & 1);
        auVar44._52_4_ = (uint)bVar23 * auVar39._52_4_ | (uint)!bVar23 * auVar38._52_4_;
        bVar23 = (bool)((byte)(uVar30 >> 0xe) & 1);
        auVar44._56_4_ = (uint)bVar23 * auVar39._56_4_ | (uint)!bVar23 * auVar38._56_4_;
        bVar23 = SUB81(uVar30 >> 0xf,0);
        auVar44._60_4_ = (uint)bVar23 * auVar39._60_4_ | (uint)!bVar23 * auVar38._60_4_;
        local_a000 = vmovdqa64_avx512f(auVar44);
        auVar39 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        auVar38 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar74);
        bVar23 = (bool)((byte)uVar35 & 1);
        local_9fc0 = (uint)bVar23 * auVar38._0_4_ | (uint)!bVar23 * auVar39._0_4_;
        bVar23 = (bool)((byte)(uVar35 >> 1) & 1);
        uStack_9fbc = (uint)bVar23 * auVar38._4_4_ | (uint)!bVar23 * auVar39._4_4_;
        bVar23 = (bool)((byte)(uVar35 >> 2) & 1);
        uStack_9fb8 = (uint)bVar23 * auVar38._8_4_ | (uint)!bVar23 * auVar39._8_4_;
        bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
        uStack_9fb4 = (uint)bVar23 * auVar38._12_4_ | (uint)!bVar23 * auVar39._12_4_;
        bVar23 = (bool)((byte)(uVar35 >> 4) & 1);
        uStack_9fb0 = (uint)bVar23 * auVar38._16_4_ | (uint)!bVar23 * auVar39._16_4_;
        bVar23 = (bool)((byte)(uVar35 >> 5) & 1);
        uStack_9fac = (uint)bVar23 * auVar38._20_4_ | (uint)!bVar23 * auVar39._20_4_;
        bVar23 = (bool)((byte)(uVar35 >> 6) & 1);
        uStack_9fa8 = (uint)bVar23 * auVar38._24_4_ | (uint)!bVar23 * auVar39._24_4_;
        bVar23 = (bool)((byte)(uVar35 >> 7) & 1);
        uStack_9fa4 = (uint)bVar23 * auVar38._28_4_ | (uint)!bVar23 * auVar39._28_4_;
        bVar10 = (byte)(uVar35 >> 8);
        bVar23 = (bool)(bVar10 & 1);
        uStack_9fa0 = (uint)bVar23 * auVar38._32_4_ | (uint)!bVar23 * auVar39._32_4_;
        bVar23 = (bool)((byte)(uVar35 >> 9) & 1);
        uStack_9f9c = (uint)bVar23 * auVar38._36_4_ | (uint)!bVar23 * auVar39._36_4_;
        bVar23 = (bool)((byte)(uVar35 >> 10) & 1);
        uStack_9f98 = (uint)bVar23 * auVar38._40_4_ | (uint)!bVar23 * auVar39._40_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xb) & 1);
        uStack_9f94 = (uint)bVar23 * auVar38._44_4_ | (uint)!bVar23 * auVar39._44_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
        uStack_9f90 = (uint)bVar23 * auVar38._48_4_ | (uint)!bVar23 * auVar39._48_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xd) & 1);
        uStack_9f8c = (uint)bVar23 * auVar38._52_4_ | (uint)!bVar23 * auVar39._52_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xe) & 1);
        uStack_9f88 = (uint)bVar23 * auVar38._56_4_ | (uint)!bVar23 * auVar39._56_4_;
        bVar23 = SUB81(uVar35 >> 0xf,0);
        uStack_9f84 = (uint)bVar23 * auVar38._60_4_ | (uint)!bVar23 * auVar39._60_4_;
        auVar38 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        local_a930 = (uint)uVar35;
        auVar74 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar74);
        bVar23 = (bool)((byte)uVar35 & 1);
        local_9f80 = (uint)bVar23 * auVar74._0_4_ | (uint)!bVar23 * auVar38._0_4_;
        bVar23 = (bool)((byte)(uVar35 >> 1) & 1);
        uStack_9f7c = (uint)bVar23 * auVar74._4_4_ | (uint)!bVar23 * auVar38._4_4_;
        bVar23 = (bool)((byte)(uVar35 >> 2) & 1);
        uStack_9f78 = (uint)bVar23 * auVar74._8_4_ | (uint)!bVar23 * auVar38._8_4_;
        bVar23 = (bool)((byte)(uVar35 >> 3) & 1);
        uStack_9f74 = (uint)bVar23 * auVar74._12_4_ | (uint)!bVar23 * auVar38._12_4_;
        bVar23 = (bool)((byte)(uVar35 >> 4) & 1);
        uStack_9f70 = (uint)bVar23 * auVar74._16_4_ | (uint)!bVar23 * auVar38._16_4_;
        bVar23 = (bool)((byte)(uVar35 >> 5) & 1);
        uStack_9f6c = (uint)bVar23 * auVar74._20_4_ | (uint)!bVar23 * auVar38._20_4_;
        bVar23 = (bool)((byte)(uVar35 >> 6) & 1);
        uStack_9f68 = (uint)bVar23 * auVar74._24_4_ | (uint)!bVar23 * auVar38._24_4_;
        bVar23 = (bool)((byte)(uVar35 >> 7) & 1);
        uStack_9f64 = (uint)bVar23 * auVar74._28_4_ | (uint)!bVar23 * auVar38._28_4_;
        bVar23 = (bool)(bVar10 & 1);
        uStack_9f60 = (uint)bVar23 * auVar74._32_4_ | (uint)!bVar23 * auVar38._32_4_;
        bVar23 = (bool)((byte)(uVar35 >> 9) & 1);
        uStack_9f5c = (uint)bVar23 * auVar74._36_4_ | (uint)!bVar23 * auVar38._36_4_;
        bVar23 = (bool)((byte)(uVar35 >> 10) & 1);
        uStack_9f58 = (uint)bVar23 * auVar74._40_4_ | (uint)!bVar23 * auVar38._40_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xb) & 1);
        uStack_9f54 = (uint)bVar23 * auVar74._44_4_ | (uint)!bVar23 * auVar38._44_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xc) & 1);
        uStack_9f50 = (uint)bVar23 * auVar74._48_4_ | (uint)!bVar23 * auVar38._48_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xd) & 1);
        uStack_9f4c = (uint)bVar23 * auVar74._52_4_ | (uint)!bVar23 * auVar38._52_4_;
        bVar23 = (bool)((byte)(uVar35 >> 0xe) & 1);
        uStack_9f48 = (uint)bVar23 * auVar74._56_4_ | (uint)!bVar23 * auVar38._56_4_;
        bVar23 = SUB81(uVar35 >> 0xf,0);
        uStack_9f44 = (uint)bVar23 * auVar74._60_4_ | (uint)!bVar23 * auVar38._60_4_;
        local_a95c = (uint)(ushort)~(ushort)uVar35;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar29 = 0xe;
        }
        else {
          uVar29 = 2;
          if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)
          {
            uVar29 = 0xe;
          }
        }
        local_a928 = ray + 0x200;
        puVar31 = local_9e40;
        local_9e50 = 0xfffffffffffffff8;
        pauVar27 = (undefined1 (*) [64])local_8c40;
        local_8c80 = local_9fc0;
        uStack_8c7c = uStack_9fbc;
        uStack_8c78 = uStack_9fb8;
        uStack_8c74 = uStack_9fb4;
        uStack_8c70 = uStack_9fb0;
        uStack_8c6c = uStack_9fac;
        uStack_8c68 = uStack_9fa8;
        uStack_8c64 = uStack_9fa4;
        uStack_8c60 = uStack_9fa0;
        uStack_8c5c = uStack_9f9c;
        uStack_8c58 = uStack_9f98;
        uStack_8c54 = uStack_9f94;
        uStack_8c50 = uStack_9f90;
        uStack_8c4c = uStack_9f8c;
        uStack_8c48 = uStack_9f88;
        uStack_8c44 = uStack_9f84;
        auVar38 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
        auVar37 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar74 = ZEXT1664(auVar37);
        local_a938 = context;
        local_a910 = This;
        local_8cc0 = auVar39;
LAB_01e375e3:
        do {
          do {
            root.ptr = puVar31[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01e37fe3;
            puVar31 = puVar31 + -1;
            pauVar27 = pauVar27 + -1;
            auVar40 = *pauVar27;
            auVar45._4_4_ = uStack_9f7c;
            auVar45._0_4_ = local_9f80;
            auVar45._8_4_ = uStack_9f78;
            auVar45._12_4_ = uStack_9f74;
            auVar45._16_4_ = uStack_9f70;
            auVar45._20_4_ = uStack_9f6c;
            auVar45._24_4_ = uStack_9f68;
            auVar45._28_4_ = uStack_9f64;
            auVar45._32_4_ = uStack_9f60;
            auVar45._36_4_ = uStack_9f5c;
            auVar45._40_4_ = uStack_9f58;
            auVar45._44_4_ = uStack_9f54;
            auVar45._48_4_ = uStack_9f50;
            auVar45._52_4_ = uStack_9f4c;
            auVar45._56_4_ = uStack_9f48;
            auVar45._60_4_ = uStack_9f44;
            uVar35 = vcmpps_avx512f(auVar40,auVar45,1);
          } while ((short)uVar35 == 0);
          uVar34 = (undefined4)uVar35;
          if (uVar29 < (uint)POPCOUNT(uVar34)) {
LAB_01e37625:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01e37fe3;
                auVar46._4_4_ = uStack_9f7c;
                auVar46._0_4_ = local_9f80;
                auVar46._8_4_ = uStack_9f78;
                auVar46._12_4_ = uStack_9f74;
                auVar46._16_4_ = uStack_9f70;
                auVar46._20_4_ = uStack_9f6c;
                auVar46._24_4_ = uStack_9f68;
                auVar46._28_4_ = uStack_9f64;
                auVar46._32_4_ = uStack_9f60;
                auVar46._36_4_ = uStack_9f5c;
                auVar46._40_4_ = uStack_9f58;
                auVar46._44_4_ = uStack_9f54;
                auVar46._48_4_ = uStack_9f50;
                auVar46._52_4_ = uStack_9f4c;
                auVar46._56_4_ = uStack_9f48;
                auVar46._60_4_ = uStack_9f44;
                uVar19 = vcmpps_avx512f(auVar40,auVar46,9);
                if ((short)uVar19 == 0) goto LAB_01e375e3;
                local_a900 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar25 = ~local_a95c;
                lVar32 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
                lVar26 = 0;
                goto LAB_01e377f8;
              }
              uVar35 = 8;
              auVar40 = auVar39;
              for (lVar26 = 0;
                  (lVar26 != 8 &&
                  (uVar30 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar26 * 8), uVar30 != 8));
                  lVar26 = lVar26 + 1) {
                auVar41 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x40 + lVar26 * 4)));
                auVar41 = vfmsub132ps_avx512f(auVar41,local_a140,local_a200);
                auVar42 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x80 + lVar26 * 4)));
                auVar43 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xc0 + lVar26 * 4)));
                auVar42 = vfmsub132ps_avx512f(auVar42,local_a100,local_a1c0);
                auVar43 = vfmsub132ps_avx512f(auVar43,local_a0c0,local_a180);
                uVar34 = *(undefined4 *)(root.ptr + 0x60 + lVar26 * 4);
                auVar47._4_4_ = uVar34;
                auVar47._0_4_ = uVar34;
                auVar47._8_4_ = uVar34;
                auVar47._12_4_ = uVar34;
                auVar47._16_4_ = uVar34;
                auVar47._20_4_ = uVar34;
                auVar47._24_4_ = uVar34;
                auVar47._28_4_ = uVar34;
                auVar47._32_4_ = uVar34;
                auVar47._36_4_ = uVar34;
                auVar47._40_4_ = uVar34;
                auVar47._44_4_ = uVar34;
                auVar47._48_4_ = uVar34;
                auVar47._52_4_ = uVar34;
                auVar47._56_4_ = uVar34;
                auVar47._60_4_ = uVar34;
                auVar44 = vfmsub132ps_avx512f(local_a200,local_a140,auVar47);
                uVar34 = *(undefined4 *)(root.ptr + 0xa0 + lVar26 * 4);
                auVar49._4_4_ = uVar34;
                auVar49._0_4_ = uVar34;
                auVar49._8_4_ = uVar34;
                auVar49._12_4_ = uVar34;
                auVar49._16_4_ = uVar34;
                auVar49._20_4_ = uVar34;
                auVar49._24_4_ = uVar34;
                auVar49._28_4_ = uVar34;
                auVar49._32_4_ = uVar34;
                auVar49._36_4_ = uVar34;
                auVar49._40_4_ = uVar34;
                auVar49._44_4_ = uVar34;
                auVar49._48_4_ = uVar34;
                auVar49._52_4_ = uVar34;
                auVar49._56_4_ = uVar34;
                auVar49._60_4_ = uVar34;
                auVar45 = vfmsub132ps_avx512f(local_a1c0,local_a100,auVar49);
                uVar34 = *(undefined4 *)(root.ptr + 0xe0 + lVar26 * 4);
                auVar50._4_4_ = uVar34;
                auVar50._0_4_ = uVar34;
                auVar50._8_4_ = uVar34;
                auVar50._12_4_ = uVar34;
                auVar50._16_4_ = uVar34;
                auVar50._20_4_ = uVar34;
                auVar50._24_4_ = uVar34;
                auVar50._28_4_ = uVar34;
                auVar50._32_4_ = uVar34;
                auVar50._36_4_ = uVar34;
                auVar50._40_4_ = uVar34;
                auVar50._44_4_ = uVar34;
                auVar50._48_4_ = uVar34;
                auVar50._52_4_ = uVar34;
                auVar50._56_4_ = uVar34;
                auVar50._60_4_ = uVar34;
                auVar46 = vfmsub132ps_avx512f(local_a180,local_a0c0,auVar50);
                auVar47 = vminps_avx512f(auVar41,auVar44);
                auVar48 = vminps_avx512f(auVar42,auVar45);
                auVar47 = vpmaxsd_avx512f(auVar47,auVar48);
                auVar48 = vminps_avx512f(auVar43,auVar46);
                auVar47 = vpmaxsd_avx512f(auVar47,auVar48);
                auVar41 = vmaxps_avx512f(auVar41,auVar44);
                auVar42 = vmaxps_avx512f(auVar42,auVar45);
                auVar41 = vpminsd_avx512f(auVar41,auVar42);
                auVar42 = vmaxps_avx512f(auVar43,auVar46);
                auVar41 = vpminsd_avx512f(auVar41,auVar42);
                auVar51._4_4_ = uStack_9fbc;
                auVar51._0_4_ = local_9fc0;
                auVar51._8_4_ = uStack_9fb8;
                auVar51._12_4_ = uStack_9fb4;
                auVar51._16_4_ = uStack_9fb0;
                auVar51._20_4_ = uStack_9fac;
                auVar51._24_4_ = uStack_9fa8;
                auVar51._28_4_ = uStack_9fa4;
                auVar51._32_4_ = uStack_9fa0;
                auVar51._36_4_ = uStack_9f9c;
                auVar51._40_4_ = uStack_9f98;
                auVar51._44_4_ = uStack_9f94;
                auVar51._48_4_ = uStack_9f90;
                auVar51._52_4_ = uStack_9f8c;
                auVar51._56_4_ = uStack_9f88;
                auVar51._60_4_ = uStack_9f84;
                auVar42 = vpmaxsd_avx512f(auVar47,auVar51);
                auVar52._4_4_ = uStack_9f7c;
                auVar52._0_4_ = local_9f80;
                auVar52._8_4_ = uStack_9f78;
                auVar52._12_4_ = uStack_9f74;
                auVar52._16_4_ = uStack_9f70;
                auVar52._20_4_ = uStack_9f6c;
                auVar52._24_4_ = uStack_9f68;
                auVar52._28_4_ = uStack_9f64;
                auVar52._32_4_ = uStack_9f60;
                auVar52._36_4_ = uStack_9f5c;
                auVar52._40_4_ = uStack_9f58;
                auVar52._44_4_ = uStack_9f54;
                auVar52._48_4_ = uStack_9f50;
                auVar52._52_4_ = uStack_9f4c;
                auVar52._56_4_ = uStack_9f48;
                auVar52._60_4_ = uStack_9f44;
                auVar41 = vpminsd_avx512f(auVar41,auVar52);
                uVar21 = vpcmpd_avx512f(auVar42,auVar41,2);
                uVar28 = uVar35;
                auVar53 = auVar40;
                if ((short)uVar21 != 0) {
                  auVar41 = vblendmps_avx512f(auVar39,auVar47);
                  bVar23 = (bool)((byte)uVar21 & 1);
                  auVar53._0_4_ = (uint)bVar23 * auVar41._0_4_ | (uint)!bVar23 * auVar47._0_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar23 * auVar41._4_4_ | (uint)!bVar23 * auVar47._4_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar23 * auVar41._8_4_ | (uint)!bVar23 * auVar47._8_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 3) & 1);
                  auVar53._12_4_ = (uint)bVar23 * auVar41._12_4_ | (uint)!bVar23 * auVar47._12_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 4) & 1);
                  auVar53._16_4_ = (uint)bVar23 * auVar41._16_4_ | (uint)!bVar23 * auVar47._16_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 5) & 1);
                  auVar53._20_4_ = (uint)bVar23 * auVar41._20_4_ | (uint)!bVar23 * auVar47._20_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 6) & 1);
                  auVar53._24_4_ = (uint)bVar23 * auVar41._24_4_ | (uint)!bVar23 * auVar47._24_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 7) & 1);
                  auVar53._28_4_ = (uint)bVar23 * auVar41._28_4_ | (uint)!bVar23 * auVar47._28_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 8) & 1);
                  auVar53._32_4_ = (uint)bVar23 * auVar41._32_4_ | (uint)!bVar23 * auVar47._32_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 9) & 1);
                  auVar53._36_4_ = (uint)bVar23 * auVar41._36_4_ | (uint)!bVar23 * auVar47._36_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 10) & 1);
                  auVar53._40_4_ = (uint)bVar23 * auVar41._40_4_ | (uint)!bVar23 * auVar47._40_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 0xb) & 1);
                  auVar53._44_4_ = (uint)bVar23 * auVar41._44_4_ | (uint)!bVar23 * auVar47._44_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 0xc) & 1);
                  auVar53._48_4_ = (uint)bVar23 * auVar41._48_4_ | (uint)!bVar23 * auVar47._48_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 0xd) & 1);
                  auVar53._52_4_ = (uint)bVar23 * auVar41._52_4_ | (uint)!bVar23 * auVar47._52_4_;
                  bVar23 = (bool)((byte)(uVar21 >> 0xe) & 1);
                  auVar53._56_4_ = (uint)bVar23 * auVar41._56_4_ | (uint)!bVar23 * auVar47._56_4_;
                  bVar23 = SUB81(uVar21 >> 0xf,0);
                  auVar53._60_4_ = (uint)bVar23 * auVar41._60_4_ | (uint)!bVar23 * auVar47._60_4_;
                  uVar28 = uVar30;
                  if (uVar35 != 8) {
                    *puVar31 = uVar35;
                    puVar31 = puVar31 + 1;
                    *pauVar27 = auVar40;
                    pauVar27 = pauVar27 + 1;
                  }
                }
                uVar35 = uVar28;
                auVar40 = auVar53;
              }
              if (uVar35 == 8) goto LAB_01e37794;
              auVar54._4_4_ = uStack_9f7c;
              auVar54._0_4_ = local_9f80;
              auVar54._8_4_ = uStack_9f78;
              auVar54._12_4_ = uStack_9f74;
              auVar54._16_4_ = uStack_9f70;
              auVar54._20_4_ = uStack_9f6c;
              auVar54._24_4_ = uStack_9f68;
              auVar54._28_4_ = uStack_9f64;
              auVar54._32_4_ = uStack_9f60;
              auVar54._36_4_ = uStack_9f5c;
              auVar54._40_4_ = uStack_9f58;
              auVar54._44_4_ = uStack_9f54;
              auVar54._48_4_ = uStack_9f50;
              auVar54._52_4_ = uStack_9f4c;
              auVar54._56_4_ = uStack_9f48;
              auVar54._60_4_ = uStack_9f44;
              uVar19 = vcmpps_avx512f(auVar40,auVar54,9);
              root.ptr = uVar35;
            } while ((ushort)uVar29 < (ushort)POPCOUNT((int)uVar19));
            *puVar31 = uVar35;
            puVar31 = puVar31 + 1;
            *pauVar27 = auVar40;
            pauVar27 = pauVar27 + 1;
LAB_01e37794:
            iVar36 = 4;
          }
          else {
            while (local_a880 = auVar40, auVar37 = auVar74._0_16_, uVar35 != 0) {
              local_a940 = 0;
              for (uVar30 = uVar35; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                local_a940 = local_a940 + 1;
              }
              uVar35 = uVar35 - 1 & uVar35;
              bVar23 = occluded1(local_a910,local_a918,root,local_a940,&local_a941,ray,
                                 (TravRayK<16,_false> *)&local_a380.field_0,local_a938);
              auVar37 = vxorps_avx512vl(auVar37,auVar37);
              auVar74 = ZEXT1664(auVar37);
              auVar38 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
              auVar39 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              uVar25 = 1 << ((uint)local_a940 & 0x1f);
              if (!bVar23) {
                uVar25 = 0;
              }
              local_a95c = local_a95c | uVar25;
              auVar40 = local_a880;
            }
            iVar36 = 3;
            if ((short)local_a95c != -1) {
              auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              bVar23 = (bool)((byte)local_a95c & 1);
              local_9f80 = (uint)bVar23 * auVar40._0_4_ | !bVar23 * local_9f80;
              bVar23 = (bool)((byte)(local_a95c >> 1) & 1);
              uStack_9f7c = (uint)bVar23 * auVar40._4_4_ | !bVar23 * uStack_9f7c;
              bVar23 = (bool)((byte)(local_a95c >> 2) & 1);
              uStack_9f78 = (uint)bVar23 * auVar40._8_4_ | !bVar23 * uStack_9f78;
              bVar23 = (bool)((byte)(local_a95c >> 3) & 1);
              uStack_9f74 = (uint)bVar23 * auVar40._12_4_ | !bVar23 * uStack_9f74;
              bVar23 = (bool)((byte)(local_a95c >> 4) & 1);
              uStack_9f70 = (uint)bVar23 * auVar40._16_4_ | !bVar23 * uStack_9f70;
              bVar23 = (bool)((byte)(local_a95c >> 5) & 1);
              uStack_9f6c = (uint)bVar23 * auVar40._20_4_ | !bVar23 * uStack_9f6c;
              bVar23 = (bool)((byte)(local_a95c >> 6) & 1);
              uStack_9f68 = (uint)bVar23 * auVar40._24_4_ | !bVar23 * uStack_9f68;
              bVar23 = (bool)((byte)(local_a95c >> 7) & 1);
              uStack_9f64 = (uint)bVar23 * auVar40._28_4_ | !bVar23 * uStack_9f64;
              bVar23 = (bool)((byte)(local_a95c >> 8) & 1);
              uStack_9f60 = (uint)bVar23 * auVar40._32_4_ | !bVar23 * uStack_9f60;
              bVar23 = (bool)((byte)(local_a95c >> 9) & 1);
              uStack_9f5c = (uint)bVar23 * auVar40._36_4_ | !bVar23 * uStack_9f5c;
              bVar23 = (bool)((byte)(local_a95c >> 10) & 1);
              uStack_9f58 = (uint)bVar23 * auVar40._40_4_ | !bVar23 * uStack_9f58;
              bVar23 = (bool)((byte)(local_a95c >> 0xb) & 1);
              uStack_9f54 = (uint)bVar23 * auVar40._44_4_ | !bVar23 * uStack_9f54;
              bVar23 = (bool)((byte)(local_a95c >> 0xc) & 1);
              uStack_9f50 = (uint)bVar23 * auVar40._48_4_ | !bVar23 * uStack_9f50;
              bVar23 = (bool)((byte)(local_a95c >> 0xd) & 1);
              uStack_9f4c = (uint)bVar23 * auVar40._52_4_ | !bVar23 * uStack_9f4c;
              bVar23 = (bool)((byte)(local_a95c >> 0xe) & 1);
              uStack_9f48 = (uint)bVar23 * auVar40._56_4_ | !bVar23 * uStack_9f48;
              bVar23 = (bool)((byte)(local_a95c >> 0xf) & 1);
              uStack_9f44 = (uint)bVar23 * auVar40._60_4_ | !bVar23 * uStack_9f44;
              iVar36 = 2;
            }
            auVar40 = local_a880;
            if (uVar29 < (uint)POPCOUNT(uVar34)) goto LAB_01e37625;
          }
        } while ((iVar36 == 4) || (iVar36 == 2));
LAB_01e37fe3:
        local_a95c = local_a95c & local_a930;
        auVar38 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        bVar23 = (bool)((byte)local_a95c & 1);
        bVar3 = (bool)((byte)(local_a95c >> 1) & 1);
        bVar4 = (bool)((byte)(local_a95c >> 2) & 1);
        bVar5 = (bool)((byte)(local_a95c >> 3) & 1);
        bVar6 = (bool)((byte)(local_a95c >> 4) & 1);
        bVar7 = (bool)((byte)(local_a95c >> 5) & 1);
        bVar8 = (bool)((byte)(local_a95c >> 6) & 1);
        bVar9 = (bool)((byte)(local_a95c >> 7) & 1);
        bVar11 = (bool)((byte)(local_a95c >> 8) & 1);
        bVar12 = (bool)((byte)(local_a95c >> 9) & 1);
        bVar13 = (bool)((byte)(local_a95c >> 10) & 1);
        bVar14 = (bool)((byte)(local_a95c >> 0xb) & 1);
        bVar15 = (bool)((byte)(local_a95c >> 0xc) & 1);
        bVar16 = (bool)((byte)(local_a95c >> 0xd) & 1);
        bVar17 = (bool)((byte)(local_a95c >> 0xe) & 1);
        bVar18 = (bool)((byte)(local_a95c >> 0xf) & 1);
        *(uint *)local_a928 = (uint)bVar23 * auVar38._0_4_ | (uint)!bVar23 * *(int *)local_a928;
        *(uint *)(local_a928 + 4) =
             (uint)bVar3 * auVar38._4_4_ | (uint)!bVar3 * *(int *)(local_a928 + 4);
        *(uint *)(local_a928 + 8) =
             (uint)bVar4 * auVar38._8_4_ | (uint)!bVar4 * *(int *)(local_a928 + 8);
        *(uint *)(local_a928 + 0xc) =
             (uint)bVar5 * auVar38._12_4_ | (uint)!bVar5 * *(int *)(local_a928 + 0xc);
        *(uint *)(local_a928 + 0x10) =
             (uint)bVar6 * auVar38._16_4_ | (uint)!bVar6 * *(int *)(local_a928 + 0x10);
        *(uint *)(local_a928 + 0x14) =
             (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * *(int *)(local_a928 + 0x14);
        *(uint *)(local_a928 + 0x18) =
             (uint)bVar8 * auVar38._24_4_ | (uint)!bVar8 * *(int *)(local_a928 + 0x18);
        *(uint *)(local_a928 + 0x1c) =
             (uint)bVar9 * auVar38._28_4_ | (uint)!bVar9 * *(int *)(local_a928 + 0x1c);
        *(uint *)(local_a928 + 0x20) =
             (uint)bVar11 * auVar38._32_4_ | (uint)!bVar11 * *(int *)(local_a928 + 0x20);
        *(uint *)(local_a928 + 0x24) =
             (uint)bVar12 * auVar38._36_4_ | (uint)!bVar12 * *(int *)(local_a928 + 0x24);
        *(uint *)(local_a928 + 0x28) =
             (uint)bVar13 * auVar38._40_4_ | (uint)!bVar13 * *(int *)(local_a928 + 0x28);
        *(uint *)(local_a928 + 0x2c) =
             (uint)bVar14 * auVar38._44_4_ | (uint)!bVar14 * *(int *)(local_a928 + 0x2c);
        *(uint *)(local_a928 + 0x30) =
             (uint)bVar15 * auVar38._48_4_ | (uint)!bVar15 * *(int *)(local_a928 + 0x30);
        *(uint *)(local_a928 + 0x34) =
             (uint)bVar16 * auVar38._52_4_ | (uint)!bVar16 * *(int *)(local_a928 + 0x34);
        *(uint *)(local_a928 + 0x38) =
             (uint)bVar17 * auVar38._56_4_ | (uint)!bVar17 * *(int *)(local_a928 + 0x38);
        *(uint *)(local_a928 + 0x3c) =
             (uint)bVar18 * auVar38._60_4_ | (uint)!bVar18 * *(int *)(local_a928 + 0x3c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01e377f8:
  do {
    lVar33 = -0x10;
    uVar22 = uVar25;
    if (lVar26 == local_a900) goto LAB_01e37ebe;
    do {
      local_a8f8 = lVar26;
      local_a92c = uVar22;
      auVar40 = _local_a8c0;
      uVar35 = (ulong)uVar25;
      if ((lVar33 == 0) || (uVar30 = (ulong)*(uint *)(lVar32 + lVar33), uVar30 == 0xffffffff))
      goto LAB_01e37e9b;
      auVar41 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x90 + lVar33)));
      auVar42 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x80 + lVar33)));
      auVar43 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x70 + lVar33)));
      auVar47 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x60 + lVar33)));
      auVar48 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x50 + lVar33)));
      auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x40 + lVar33)));
      auVar50 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x30 + lVar33)));
      auVar51 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x20 + lVar33)));
      auVar52 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar32 + -0x10 + lVar33)));
      auVar37 = vmulss_avx512f(auVar48._0_16_,auVar52._0_16_);
      auVar44 = vbroadcastss_avx512f(auVar37);
      auVar46 = vfmsub231ps_avx512f(auVar44,auVar51,auVar49);
      auVar44 = vbroadcastss_avx512f(ZEXT416((uint)(auVar49._0_4_ * auVar50._0_4_)));
      auVar45 = vfmsub231ps_avx512f(auVar44,auVar52,auVar47);
      auVar44 = vbroadcastss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar47._0_4_)));
      auVar53 = vsubps_avx512f(auVar41,*(undefined1 (*) [64])ray);
      auVar54 = vsubps_avx512f(auVar42,*(undefined1 (*) [64])(ray + 0x40));
      auVar55 = vsubps_avx512f(auVar43,*(undefined1 (*) [64])(ray + 0x80));
      auVar41 = *(undefined1 (*) [64])(ray + 0x100);
      auVar42 = *(undefined1 (*) [64])(ray + 0x140);
      auVar43 = *(undefined1 (*) [64])(ray + 0x180);
      auVar44 = vfmsub231ps_avx512f(auVar44,auVar50,auVar48);
      auVar56 = vmulps_avx512f(auVar42,auVar55);
      auVar56 = vfmsub231ps_avx512f(auVar56,auVar54,auVar43);
      auVar57 = vmulps_avx512f(auVar43,auVar53);
      auVar57 = vfmsub231ps_avx512f(auVar57,auVar55,auVar41);
      auVar58 = vmulps_avx512f(auVar41,auVar54);
      auVar58 = vfmsub231ps_avx512f(auVar58,auVar53,auVar42);
      auVar43 = vmulps_avx512f(auVar44,auVar43);
      auVar42 = vfmadd231ps_avx512f(auVar43,auVar45,auVar42);
      auVar42 = vfmadd231ps_avx512f(auVar42,auVar46,auVar41);
      auVar43 = vandps_avx512dq(auVar42,auVar38);
      auVar41 = vmulps_avx512f(auVar52,auVar58);
      auVar41 = vfmadd231ps_avx512f(auVar41,auVar57,auVar51);
      auVar41 = vfmadd231ps_avx512f(auVar41,auVar56,auVar50);
      auVar41 = vxorps_avx512dq(auVar43,auVar41);
      uVar19 = vcmpps_avx512f(auVar41,auVar74,5);
      uVar24 = (ushort)uVar19 & (ushort)uVar25;
      local_a940 = CONCAT44(local_a940._4_4_,uVar25);
      if (uVar24 == 0) {
LAB_01e37942:
        uVar24 = 0;
      }
      else {
        auVar49 = vmulps_avx512f(auVar49,auVar58);
        auVar48 = vfmadd213ps_avx512f(auVar57,auVar48,auVar49);
        auVar47 = vfmadd213ps_avx512f(auVar56,auVar47,auVar48);
        auVar47 = vxorps_avx512dq(auVar43,auVar47);
        uVar19 = vcmpps_avx512f(auVar47,auVar74,5);
        uVar24 = uVar24 & (ushort)uVar19;
        if (uVar24 == 0) goto LAB_01e37942;
        auVar48._8_4_ = 0x7fffffff;
        auVar48._0_8_ = 0x7fffffff7fffffff;
        auVar48._12_4_ = 0x7fffffff;
        auVar48._16_4_ = 0x7fffffff;
        auVar48._20_4_ = 0x7fffffff;
        auVar48._24_4_ = 0x7fffffff;
        auVar48._28_4_ = 0x7fffffff;
        auVar48._32_4_ = 0x7fffffff;
        auVar48._36_4_ = 0x7fffffff;
        auVar48._40_4_ = 0x7fffffff;
        auVar48._44_4_ = 0x7fffffff;
        auVar48._48_4_ = 0x7fffffff;
        auVar48._52_4_ = 0x7fffffff;
        auVar48._56_4_ = 0x7fffffff;
        auVar48._60_4_ = 0x7fffffff;
        auVar48 = vandpd_avx512dq(auVar42,auVar48);
        auVar49 = vsubps_avx512f(auVar48,auVar41);
        uVar19 = vcmpps_avx512f(auVar49,auVar47,5);
        uVar24 = uVar24 & (ushort)uVar19;
        if (uVar24 == 0) goto LAB_01e37942;
        auVar38 = vmulps_avx512f(auVar44,auVar55);
        auVar38 = vfmadd213ps_avx512f(auVar54,auVar45,auVar38);
        auVar38 = vfmadd213ps_avx512f(auVar53,auVar46,auVar38);
        auVar38 = vxorps_avx512dq(auVar43,auVar38);
        auVar39 = vmulps_avx512f(auVar48,*(undefined1 (*) [64])(ray + 0xc0));
        auVar43 = vmulps_avx512f(auVar48,*(undefined1 (*) [64])(ray + 0x200));
        uVar19 = vcmpps_avx512f(auVar38,auVar43,2);
        uVar20 = vcmpps_avx512f(auVar39,auVar38,1);
        uVar24 = uVar24 & (ushort)uVar19 & (ushort)uVar20;
        if (uVar24 == 0) {
LAB_01e37e91:
          uVar24 = 0;
          auVar44 = local_a840;
          auVar45 = local_a800;
          auVar46 = local_a7c0;
          auVar48 = local_a780;
          auVar38 = local_a740;
          auVar47 = local_a700;
          auVar41 = local_a6c0;
        }
        else {
          uVar19 = vcmpps_avx512f(auVar42,ZEXT1664(ZEXT816(0) << 0x40),4);
          uVar24 = uVar24 & (ushort)uVar19;
          if (uVar24 == 0) goto LAB_01e37e91;
        }
        local_a6c0 = auVar41;
        local_a700 = auVar47;
        local_a740 = auVar38;
        local_a780 = auVar48;
        local_a7c0 = auVar46;
        local_a800 = auVar45;
        local_a840 = auVar44;
        auVar39 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        auVar38 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
        auVar37 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
        auVar74 = ZEXT1664(auVar37);
      }
      auVar37 = auVar74._0_16_;
      pGVar1 = (local_a938->scene->geometries).items[uVar30].ptr;
      auVar41 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
      uVar19 = vptestmd_avx512f(auVar41,*(undefined1 (*) [64])(ray + 0x240));
      uVar24 = (ushort)uVar19 & uVar24;
      if (uVar24 != 0) {
        local_a880._0_4_ = *(undefined4 *)(lVar32 + 0x10 + lVar33);
        if ((local_a938->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar74 = vrcp14ps_avx512f(local_a780);
          auVar38._8_4_ = 0x3f800000;
          auVar38._0_8_ = 0x3f8000003f800000;
          auVar38._12_4_ = 0x3f800000;
          auVar38._16_4_ = 0x3f800000;
          auVar38._20_4_ = 0x3f800000;
          auVar38._24_4_ = 0x3f800000;
          auVar38._28_4_ = 0x3f800000;
          auVar38._32_4_ = 0x3f800000;
          auVar38._36_4_ = 0x3f800000;
          auVar38._40_4_ = 0x3f800000;
          auVar38._44_4_ = 0x3f800000;
          auVar38._48_4_ = 0x3f800000;
          auVar38._52_4_ = 0x3f800000;
          auVar38._56_4_ = 0x3f800000;
          auVar38._60_4_ = 0x3f800000;
          auVar38 = vfnmadd213ps_avx512f(auVar74,local_a780,auVar38);
          auVar38 = vfmadd132ps_avx512f(auVar38,auVar74,auVar74);
          local_a5c0 = vmulps_avx512f(auVar38,local_a740);
          local_a540 = vmulps_avx512f(auVar38,local_a6c0);
          local_a580 = vmulps_avx512f(auVar38,local_a700);
          local_a680._0_8_ = local_a7c0._0_8_;
          local_a680._8_8_ = local_a7c0._8_8_;
          local_a680._16_8_ = local_a7c0._16_8_;
          local_a680._24_8_ = local_a7c0._24_8_;
          local_a680._32_8_ = local_a7c0._32_8_;
          local_a680._40_8_ = local_a7c0._40_8_;
          local_a680._48_8_ = local_a7c0._48_8_;
          local_a680._56_8_ = local_a7c0._56_8_;
          local_a680._64_8_ = local_a800._0_8_;
          local_a680._72_8_ = local_a800._8_8_;
          local_a680._80_8_ = local_a800._16_8_;
          local_a680._88_8_ = local_a800._24_8_;
          local_a680._96_8_ = local_a800._32_8_;
          local_a680._104_8_ = local_a800._40_8_;
          local_a680._112_8_ = local_a800._48_8_;
          local_a680._120_8_ = local_a800._56_8_;
          local_a680._128_8_ = local_a840._0_8_;
          local_a680._136_8_ = local_a840._8_8_;
          local_a680._144_8_ = local_a840._16_8_;
          local_a680._152_8_ = local_a840._24_8_;
          local_a680._160_8_ = local_a840._32_8_;
          local_a680._168_8_ = local_a840._40_8_;
          local_a680._176_8_ = local_a840._48_8_;
          local_a680._184_8_ = local_a840._56_8_;
          local_a8c0._8_8_ = (vfloat_impl<16> *)local_a440;
          local_a8c0._0_8_ = &local_9f40;
          _Stack_a8b0._M_head_impl = (vfloat_impl<16> *)local_a400;
          auStack_a8a0 = auVar40._32_32_;
          _Stack_a8a8._M_head_impl = (vfloat_impl<16> *)local_a3c0;
          local_a920 = pGVar1;
          local_a908 = uVar30;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
          ::
          _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                      *)local_a8c0,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                      *)&local_a680.field_0);
          auVar38 = vpbroadcastd_avx512f();
          auVar74 = vpbroadcastd_avx512f();
          local_a680._0_8_ = local_9f40;
          local_a680._8_8_ = uStack_9f38;
          local_a680._16_8_ = uStack_9f30;
          local_a680._24_8_ = uStack_9f28;
          local_a680._32_8_ = uStack_9f20;
          local_a680._40_8_ = uStack_9f18;
          local_a680._48_8_ = uStack_9f10;
          local_a680._56_8_ = uStack_9f08;
          local_a680._64_8_ = local_9f00;
          local_a680._72_8_ = uStack_9ef8;
          local_a680._80_8_ = uStack_9ef0;
          local_a680._88_8_ = uStack_9ee8;
          local_a680._96_8_ = uStack_9ee0;
          local_a680._104_8_ = uStack_9ed8;
          local_a680._112_8_ = uStack_9ed0;
          local_a680._120_8_ = uStack_9ec8;
          local_a680._128_8_ = local_9ec0;
          local_a680._136_8_ = uStack_9eb8;
          local_a680._144_8_ = uStack_9eb0;
          local_a680._152_8_ = uStack_9ea8;
          local_a680._160_8_ = uStack_9ea0;
          local_a680._168_8_ = uStack_9e98;
          local_a680._176_8_ = uStack_9e90;
          local_a680._184_8_ = uStack_9e88;
          local_a540 = vmovdqa64_avx512f(auVar74);
          local_a500 = vmovdqa64_avx512f(auVar38);
          vpcmpeqd_avx2(auVar38._0_32_,auVar38._0_32_);
          local_a4c0 = vbroadcastss_avx512f(ZEXT416(local_a938->user->instID[0]));
          local_a480 = vbroadcastss_avx512f(ZEXT416(local_a938->user->instPrimID[0]));
          local_a880 = *(undefined1 (*) [64])(ray + 0x200);
          auVar38 = vblendmps_avx512f(local_a880,local_a440);
          bVar23 = (bool)((byte)uVar24 & 1);
          bVar3 = (bool)((byte)(uVar24 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar24 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar24 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar24 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar24 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar24 >> 7) & 1);
          bVar10 = (byte)(uVar24 >> 8);
          bVar11 = (bool)(bVar10 >> 1 & 1);
          bVar12 = (bool)(bVar10 >> 2 & 1);
          bVar13 = (bool)(bVar10 >> 3 & 1);
          bVar14 = (bool)(bVar10 >> 4 & 1);
          bVar15 = (bool)(bVar10 >> 5 & 1);
          bVar16 = (bool)(bVar10 >> 6 & 1);
          *(uint *)(ray + 0x200) = (uint)bVar23 * auVar38._0_4_ | (uint)!bVar23 * local_a480._0_4_;
          *(uint *)(ray + 0x204) = (uint)bVar3 * auVar38._4_4_ | (uint)!bVar3 * local_a480._4_4_;
          *(uint *)(ray + 0x208) = (uint)bVar4 * auVar38._8_4_ | (uint)!bVar4 * local_a480._8_4_;
          *(uint *)(ray + 0x20c) = (uint)bVar5 * auVar38._12_4_ | (uint)!bVar5 * local_a480._12_4_;
          *(uint *)(ray + 0x210) = (uint)bVar6 * auVar38._16_4_ | (uint)!bVar6 * local_a480._16_4_;
          *(uint *)(ray + 0x214) = (uint)bVar7 * auVar38._20_4_ | (uint)!bVar7 * local_a480._20_4_;
          *(uint *)(ray + 0x218) = (uint)bVar8 * auVar38._24_4_ | (uint)!bVar8 * local_a480._24_4_;
          *(uint *)(ray + 0x21c) = (uint)bVar9 * auVar38._28_4_ | (uint)!bVar9 * local_a480._28_4_;
          *(uint *)(ray + 0x220) =
               (uint)(bVar10 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar10 & 1) * local_a480._32_4_;
          *(uint *)(ray + 0x224) = (uint)bVar11 * auVar38._36_4_ | (uint)!bVar11 * local_a480._36_4_
          ;
          *(uint *)(ray + 0x228) = (uint)bVar12 * auVar38._40_4_ | (uint)!bVar12 * local_a480._40_4_
          ;
          *(uint *)(ray + 0x22c) = (uint)bVar13 * auVar38._44_4_ | (uint)!bVar13 * local_a480._44_4_
          ;
          *(uint *)(ray + 0x230) = (uint)bVar14 * auVar38._48_4_ | (uint)!bVar14 * local_a480._48_4_
          ;
          *(uint *)(ray + 0x234) = (uint)bVar15 * auVar38._52_4_ | (uint)!bVar15 * local_a480._52_4_
          ;
          *(uint *)(ray + 0x238) = (uint)bVar16 * auVar38._56_4_ | (uint)!bVar16 * local_a480._56_4_
          ;
          *(uint *)(ray + 0x23c) =
               (uint)(bVar10 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar10 >> 7) * local_a480._60_4_
          ;
          auVar40 = vpmovm2d_avx512dq((ulong)uVar24);
          _local_a8c0 = vmovdqa64_avx512f(auVar40);
          local_a8f0.valid = (int *)local_a8c0;
          local_a8f0.geometryUserPtr = local_a920->userPtr;
          local_a8f0.context = local_a938->user;
          local_a8f0.hit = (RTCHitN *)&local_a680;
          local_a8f0.N = 0x10;
          local_a8f0.ray = (RTCRayN *)ray;
          if (local_a920->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*local_a920->occlusionFilterN)(&local_a8f0);
            auVar40 = vmovdqa64_avx512f(_local_a8c0);
          }
          uVar19 = vptestmd_avx512f(auVar40,auVar40);
          uVar25 = (uint)local_a940;
          if ((short)uVar19 == 0) {
            uVar35 = 0;
            auVar39 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            auVar38 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
            auVar37 = vxorps_avx512vl(auVar37,auVar37);
            auVar74 = ZEXT1664(auVar37);
          }
          else {
            p_Var2 = local_a938->args->filter;
            if (p_Var2 == (RTCFilterFunctionN)0x0) {
              auVar39 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar38 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
              auVar37 = vxorps_avx512vl(auVar37,auVar37);
              auVar74 = ZEXT1664(auVar37);
            }
            else {
              auVar39 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
              auVar38 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
              auVar37 = vxorps_avx512vl(auVar37,auVar37);
              auVar74 = ZEXT1664(auVar37);
              if (((local_a938->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((local_a920->field_8).field_0x2 & 0x40) != 0)
                 ) {
                (*p_Var2)(&local_a8f0);
                auVar37 = vxorps_avx512vl(auVar37,auVar37);
                auVar74 = ZEXT1664(auVar37);
                auVar38 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
                auVar39 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar40 = vmovdqa64_avx512f(_local_a8c0);
              }
            }
            uVar35 = vptestmd_avx512f(auVar40,auVar40);
            auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar23 = (bool)((byte)uVar35 & 1);
            bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar35 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar35 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar35 >> 6) & 1);
            bVar9 = (bool)((byte)(uVar35 >> 7) & 1);
            bVar11 = (bool)((byte)(uVar35 >> 8) & 1);
            bVar12 = (bool)((byte)(uVar35 >> 9) & 1);
            bVar13 = (bool)((byte)(uVar35 >> 10) & 1);
            bVar14 = (bool)((byte)(uVar35 >> 0xb) & 1);
            bVar15 = (bool)((byte)(uVar35 >> 0xc) & 1);
            bVar16 = (bool)((byte)(uVar35 >> 0xd) & 1);
            bVar17 = (bool)((byte)(uVar35 >> 0xe) & 1);
            bVar18 = SUB81(uVar35 >> 0xf,0);
            *(uint *)(local_a8f0.ray + 0x200) =
                 (uint)bVar23 * auVar40._0_4_ | (uint)!bVar23 * *(int *)(local_a8f0.ray + 0x200);
            *(uint *)(local_a8f0.ray + 0x204) =
                 (uint)bVar3 * auVar40._4_4_ | (uint)!bVar3 * *(int *)(local_a8f0.ray + 0x204);
            *(uint *)(local_a8f0.ray + 0x208) =
                 (uint)bVar4 * auVar40._8_4_ | (uint)!bVar4 * *(int *)(local_a8f0.ray + 0x208);
            *(uint *)(local_a8f0.ray + 0x20c) =
                 (uint)bVar5 * auVar40._12_4_ | (uint)!bVar5 * *(int *)(local_a8f0.ray + 0x20c);
            *(uint *)(local_a8f0.ray + 0x210) =
                 (uint)bVar6 * auVar40._16_4_ | (uint)!bVar6 * *(int *)(local_a8f0.ray + 0x210);
            *(uint *)(local_a8f0.ray + 0x214) =
                 (uint)bVar7 * auVar40._20_4_ | (uint)!bVar7 * *(int *)(local_a8f0.ray + 0x214);
            *(uint *)(local_a8f0.ray + 0x218) =
                 (uint)bVar8 * auVar40._24_4_ | (uint)!bVar8 * *(int *)(local_a8f0.ray + 0x218);
            *(uint *)(local_a8f0.ray + 0x21c) =
                 (uint)bVar9 * auVar40._28_4_ | (uint)!bVar9 * *(int *)(local_a8f0.ray + 0x21c);
            *(uint *)(local_a8f0.ray + 0x220) =
                 (uint)bVar11 * auVar40._32_4_ | (uint)!bVar11 * *(int *)(local_a8f0.ray + 0x220);
            *(uint *)(local_a8f0.ray + 0x224) =
                 (uint)bVar12 * auVar40._36_4_ | (uint)!bVar12 * *(int *)(local_a8f0.ray + 0x224);
            *(uint *)(local_a8f0.ray + 0x228) =
                 (uint)bVar13 * auVar40._40_4_ | (uint)!bVar13 * *(int *)(local_a8f0.ray + 0x228);
            *(uint *)(local_a8f0.ray + 0x22c) =
                 (uint)bVar14 * auVar40._44_4_ | (uint)!bVar14 * *(int *)(local_a8f0.ray + 0x22c);
            *(uint *)(local_a8f0.ray + 0x230) =
                 (uint)bVar15 * auVar40._48_4_ | (uint)!bVar15 * *(int *)(local_a8f0.ray + 0x230);
            *(uint *)(local_a8f0.ray + 0x234) =
                 (uint)bVar16 * auVar40._52_4_ | (uint)!bVar16 * *(int *)(local_a8f0.ray + 0x234);
            *(uint *)(local_a8f0.ray + 0x238) =
                 (uint)bVar17 * auVar40._56_4_ | (uint)!bVar17 * *(int *)(local_a8f0.ray + 0x238);
            *(uint *)(local_a8f0.ray + 0x23c) =
                 (uint)bVar18 * auVar40._60_4_ | (uint)!bVar18 * *(int *)(local_a8f0.ray + 0x23c);
          }
          uVar24 = (ushort)uVar35;
          bVar23 = (bool)((byte)uVar35 & 1);
          bVar3 = (bool)((byte)(uVar35 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar35 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar35 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar35 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar35 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar35 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar35 >> 7) & 1);
          bVar11 = (bool)((byte)(uVar35 >> 8) & 1);
          bVar12 = (bool)((byte)(uVar35 >> 9) & 1);
          bVar13 = (bool)((byte)(uVar35 >> 10) & 1);
          bVar14 = (bool)((byte)(uVar35 >> 0xb) & 1);
          bVar15 = (bool)((byte)(uVar35 >> 0xc) & 1);
          bVar16 = (bool)((byte)(uVar35 >> 0xd) & 1);
          bVar17 = (bool)((byte)(uVar35 >> 0xe) & 1);
          bVar18 = SUB81(uVar35 >> 0xf,0);
          *(uint *)local_a928 = (uint)bVar23 * *(int *)local_a928 | (uint)!bVar23 * local_a880._0_4_
          ;
          *(uint *)(local_a928 + 4) =
               (uint)bVar3 * *(int *)(local_a928 + 4) | (uint)!bVar3 * local_a880._4_4_;
          *(uint *)(local_a928 + 8) =
               (uint)bVar4 * *(int *)(local_a928 + 8) | (uint)!bVar4 * local_a880._8_4_;
          *(uint *)(local_a928 + 0xc) =
               (uint)bVar5 * *(int *)(local_a928 + 0xc) | (uint)!bVar5 * local_a880._12_4_;
          *(uint *)(local_a928 + 0x10) =
               (uint)bVar6 * *(int *)(local_a928 + 0x10) | (uint)!bVar6 * local_a880._16_4_;
          *(uint *)(local_a928 + 0x14) =
               (uint)bVar7 * *(int *)(local_a928 + 0x14) | (uint)!bVar7 * local_a880._20_4_;
          *(uint *)(local_a928 + 0x18) =
               (uint)bVar8 * *(int *)(local_a928 + 0x18) | (uint)!bVar8 * local_a880._24_4_;
          *(uint *)(local_a928 + 0x1c) =
               (uint)bVar9 * *(int *)(local_a928 + 0x1c) | (uint)!bVar9 * local_a880._28_4_;
          *(uint *)(local_a928 + 0x20) =
               (uint)bVar11 * *(int *)(local_a928 + 0x20) | (uint)!bVar11 * local_a880._32_4_;
          *(uint *)(local_a928 + 0x24) =
               (uint)bVar12 * *(int *)(local_a928 + 0x24) | (uint)!bVar12 * local_a880._36_4_;
          *(uint *)(local_a928 + 0x28) =
               (uint)bVar13 * *(int *)(local_a928 + 0x28) | (uint)!bVar13 * local_a880._40_4_;
          *(uint *)(local_a928 + 0x2c) =
               (uint)bVar14 * *(int *)(local_a928 + 0x2c) | (uint)!bVar14 * local_a880._44_4_;
          *(uint *)(local_a928 + 0x30) =
               (uint)bVar15 * *(int *)(local_a928 + 0x30) | (uint)!bVar15 * local_a880._48_4_;
          *(uint *)(local_a928 + 0x34) =
               (uint)bVar16 * *(int *)(local_a928 + 0x34) | (uint)!bVar16 * local_a880._52_4_;
          *(uint *)(local_a928 + 0x38) =
               (uint)bVar17 * *(int *)(local_a928 + 0x38) | (uint)!bVar17 * local_a880._56_4_;
          *(uint *)(local_a928 + 0x3c) =
               (uint)bVar18 * *(int *)(local_a928 + 0x3c) | (uint)!bVar18 * local_a880._60_4_;
        }
        uVar25 = uVar25 & (ushort)~uVar24;
      }
      lVar33 = lVar33 + 4;
      uVar22 = local_a92c;
      lVar26 = local_a8f8;
    } while ((short)uVar25 != 0);
    uVar35 = 0;
LAB_01e37e9b:
    lVar26 = local_a8f8 + 1;
    lVar32 = lVar32 + 0xb0;
    uVar24 = (ushort)uVar35 & (ushort)local_a92c;
    uVar25 = (uint)CONCAT62((int6)(uVar35 >> 0x10),uVar24);
  } while (uVar24 != 0);
  uVar25 = 0;
LAB_01e37ebe:
  local_a95c = local_a95c | ~uVar25;
  if ((short)local_a95c == -1) {
    local_a95c = 0xffff;
    goto LAB_01e37fe3;
  }
  auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
  bVar23 = (bool)((byte)local_a95c & 1);
  local_9f80 = (uint)bVar23 * auVar40._0_4_ | !bVar23 * local_9f80;
  bVar23 = (bool)((byte)(local_a95c >> 1) & 1);
  uStack_9f7c = (uint)bVar23 * auVar40._4_4_ | !bVar23 * uStack_9f7c;
  bVar23 = (bool)((byte)(local_a95c >> 2) & 1);
  uStack_9f78 = (uint)bVar23 * auVar40._8_4_ | !bVar23 * uStack_9f78;
  bVar23 = (bool)((byte)(local_a95c >> 3) & 1);
  uStack_9f74 = (uint)bVar23 * auVar40._12_4_ | !bVar23 * uStack_9f74;
  bVar23 = (bool)((byte)(local_a95c >> 4) & 1);
  uStack_9f70 = (uint)bVar23 * auVar40._16_4_ | !bVar23 * uStack_9f70;
  bVar23 = (bool)((byte)(local_a95c >> 5) & 1);
  uStack_9f6c = (uint)bVar23 * auVar40._20_4_ | !bVar23 * uStack_9f6c;
  bVar23 = (bool)((byte)(local_a95c >> 6) & 1);
  uStack_9f68 = (uint)bVar23 * auVar40._24_4_ | !bVar23 * uStack_9f68;
  bVar23 = (bool)((byte)(local_a95c >> 7) & 1);
  uStack_9f64 = (uint)bVar23 * auVar40._28_4_ | !bVar23 * uStack_9f64;
  bVar23 = (bool)((byte)(local_a95c >> 8) & 1);
  uStack_9f60 = (uint)bVar23 * auVar40._32_4_ | !bVar23 * uStack_9f60;
  bVar23 = (bool)((byte)(local_a95c >> 9) & 1);
  uStack_9f5c = (uint)bVar23 * auVar40._36_4_ | !bVar23 * uStack_9f5c;
  bVar23 = (bool)((byte)(local_a95c >> 10) & 1);
  uStack_9f58 = (uint)bVar23 * auVar40._40_4_ | !bVar23 * uStack_9f58;
  bVar23 = (bool)((byte)(local_a95c >> 0xb) & 1);
  uStack_9f54 = (uint)bVar23 * auVar40._44_4_ | !bVar23 * uStack_9f54;
  bVar23 = (bool)((byte)(local_a95c >> 0xc) & 1);
  uStack_9f50 = (uint)bVar23 * auVar40._48_4_ | !bVar23 * uStack_9f50;
  bVar23 = (bool)((byte)(local_a95c >> 0xd) & 1);
  uStack_9f4c = (uint)bVar23 * auVar40._52_4_ | !bVar23 * uStack_9f4c;
  bVar23 = (bool)((byte)(local_a95c >> 0xe) & 1);
  uStack_9f48 = (uint)bVar23 * auVar40._56_4_ | !bVar23 * uStack_9f48;
  bVar23 = (bool)((byte)(local_a95c >> 0xf) & 1);
  uStack_9f44 = (uint)bVar23 * auVar40._60_4_ | !bVar23 * uStack_9f44;
  goto LAB_01e375e3;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }